

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool __thiscall FTraceInfo::TraceTraverse(FTraceInfo *this,int ptflags)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  F3DFloor *pFVar6;
  AActor *this_00;
  sector_t *psVar7;
  FTraceResults *pFVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  intercept_t *in;
  line_t *plVar17;
  FLinePortal *pFVar18;
  FTraceResults *res;
  long lVar19;
  FTraceResults *pFVar20;
  double dist;
  double dVar21;
  sector_t *psVar22;
  double dVar23;
  DVector2 local_198;
  DVector3 local_188;
  DVector3 local_168;
  FPathTraverse it;
  FTraceResults hsecResult;
  
  Setup3DFloors(this);
  FPathTraverse::FPathTraverse
            (&it,(this->Start).X,(this->Start).Y,(this->Vec).X * this->MaxDist,
             this->MaxDist * (this->Vec).Y,ptflags | 8,this->startfrac);
  iVar16 = -1;
LAB_004e24a9:
  in = FPathTraverse::Next(&it);
  if (in == (intercept_t *)0x0) goto LAB_004e2884;
  if ((this->Results->Crossed3DWater == (F3DFloor *)0x0) && (iVar16 != this->CurSector->sectornum))
  {
    peVar4 = this->CurSector->e;
    ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar3 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar19 = 0; (ulong)uVar3 << 3 != lVar19; lVar19 = lVar19 + 8) {
      pFVar6 = *(F3DFloor **)((long)ppFVar5 + lVar19);
      if (((~pFVar6->flags & 0x11) == 0) && (bVar14 = CheckPlane(this,(pFVar6->top).plane), bVar14))
      {
        hsecResult.Sector = (sector_t *)(this->Results->HitPos).X;
        hsecResult._8_8_ = (this->Results->HitPos).Y;
        dVar23 = secplane_t::ZatPoint((pFVar6->top).plane,(DVector2 *)&hsecResult);
        local_198.X = (this->Results->HitPos).X;
        local_198.Y = (this->Results->HitPos).Y;
        dVar10 = secplane_t::ZatPoint(&this->CurSector->floorplane,&local_198);
        if (dVar10 < dVar23) {
          pFVar20 = this->Results;
          pFVar20->Crossed3DWater = pFVar6;
          (pFVar20->Crossed3DWaterPos).Z = (pFVar20->HitPos).Z;
          uVar11 = *(undefined4 *)((long)&(pFVar20->HitPos).X + 4);
          uVar12 = *(undefined4 *)&(pFVar20->HitPos).Y;
          uVar13 = *(undefined4 *)((long)&(pFVar20->HitPos).Y + 4);
          *(undefined4 *)&(pFVar20->Crossed3DWaterPos).X = *(undefined4 *)&(pFVar20->HitPos).X;
          *(undefined4 *)((long)&(pFVar20->Crossed3DWaterPos).X + 4) = uVar11;
          *(undefined4 *)&(pFVar20->Crossed3DWaterPos).Y = uVar12;
          *(undefined4 *)((long)&(pFVar20->Crossed3DWaterPos).Y + 4) = uVar13;
          pFVar20->Distance = 0.0;
        }
      }
    }
    iVar16 = this->CurSector->sectornum;
  }
  dVar23 = this->MaxDist;
  dist = in->frac * dVar23;
  dVar10 = (this->Vec).Z;
  dVar1 = (this->Start).Z;
  dVar21 = dist * dVar10 + dVar1;
  if ((0.0 <= dVar10) || (psVar22 = this->CurSector, (psVar22->planes[0].Flags & 0x1d0U) != 0x100))
  {
    if ((0.0 < dVar10) &&
       (((psVar22 = this->CurSector, (psVar22->planes[1].Flags & 0x1d0U) == 0x100 &&
         (dVar2 = sectorPortals.Array[psVar22->Portals[1]].mPlaneZ, dVar2 < dVar21)) &&
        (this->limitz <= dVar2 && dVar2 != this->limitz)))) {
      this->limitz = dVar2;
      EnterSectorPortal(this,&it,1,(dVar2 - dVar1) / (dVar23 * dVar10),psVar22);
      goto LAB_004e24a9;
    }
  }
  else {
    dVar2 = sectorPortals.Array[psVar22->Portals[0]].mPlaneZ;
    if ((dVar21 < dVar2) && (dVar2 < this->limitz)) {
      this->limitz = dVar2;
      EnterSectorPortal(this,&it,0,(dVar2 - dVar1) / (dVar23 * dVar10),psVar22);
      goto LAB_004e24a9;
    }
  }
  psVar22 = (sector_t *)((this->Vec).X * dist + (this->Start).X);
  dVar23 = (this->Vec).Y * dist + (this->Start).Y;
  this_00 = (in->d).thing;
  if (in->isaline == true) {
    bVar14 = line_t::isLinePortal((line_t *)this_00);
    if (bVar14) {
      hsecResult.Sector = (sector_t *)(this->Start).X;
      hsecResult._8_8_ = (this->Start).Y;
      iVar15 = P_PointOnLineSidePrecise((DVector2 *)&hsecResult,(in->d).line);
      if (iVar15 == 0) {
        plVar17 = (in->d).line;
        psVar7 = plVar17->backsector;
        if (psVar7 != (sector_t *)0x0) {
          hsecResult.Sector = psVar22;
          hsecResult._8_8_ = dVar23;
          dVar10 = secplane_t::ZatPoint(&psVar7->floorplane,(DVector2 *)&hsecResult);
          if ((dVar21 < dVar10) ||
             (local_198.X = (double)psVar22, local_198.Y = dVar23,
             dVar10 = secplane_t::ZatPoint(&psVar7->ceilingplane,&local_198), dVar10 < dVar21))
          goto LAB_004e27e0;
          plVar17 = (in->d).line;
        }
        pFVar18 = linePortals.Array + plVar17->portalindex;
        if (linePortals.Count <= plVar17->portalindex) {
          pFVar18 = (FLinePortal *)0x0;
        }
        if ((pFVar18->mType == '\x03') || ((this->TraceFlags & 8) == 0)) {
          EnterLinePortal(this,&it,in);
          goto LAB_004e24a9;
        }
      }
    }
LAB_004e27e0:
    local_168.X = (double)psVar22;
    local_168.Y = dVar23;
    local_168.Z = dVar21;
    bVar14 = LineCheck(this,in,dist,&local_168);
  }
  else {
    if ((((this->ActorMask).Value & (this_00->flags).Value) == 0) || (this_00 == this->IgnoreThis))
    goto LAB_004e24a9;
    local_188.X = (double)psVar22;
    local_188.Y = dVar23;
    local_188.Z = dVar21;
    bVar14 = ThingCheck(this,in,dist,&local_188);
  }
  if (bVar14 != false) goto LAB_004e24a9;
LAB_004e2884:
  pFVar20 = this->Results;
  psVar22 = this->CurSector;
  if (pFVar20->HitType != TRACE_HitNone) goto LAB_004e291e;
  if ((psVar22->planes[0].Flags & 0x1d0U) == 0x100) {
LAB_004e28d8:
    if ((psVar22->planes[1].Flags & 0x1d0U) == 0x100) {
      pFVar20 = this->Results;
      goto LAB_004e291e;
    }
    bVar14 = CheckPlane(this,&psVar22->ceilingplane);
    pFVar20 = this->Results;
    psVar22 = this->CurSector;
    if (!bVar14) goto LAB_004e291e;
    pFVar20->HitType = TRACE_HitCeiling;
    iVar16 = psVar22->planes[1].Texture.texnum;
  }
  else {
    bVar14 = CheckPlane(this,&psVar22->floorplane);
    psVar22 = this->CurSector;
    if (!bVar14) goto LAB_004e28d8;
    pFVar20 = this->Results;
    pFVar20->HitType = TRACE_HitFloor;
    iVar16 = psVar22->planes[0].Texture.texnum;
  }
  (pFVar20->HitTexture).texnum = iVar16;
LAB_004e291e:
  pFVar20->Sector = sectors + psVar22->sectornum;
  if ((pFVar20->CrossedWater == (sector_t *)0x0) && (psVar22->heightsec != (sector_t *)0x0)) {
    hsecResult.Sector = (sector_t *)(this->Start).X;
    hsecResult._8_8_ = (this->Start).Y;
    dVar23 = secplane_t::ZatPoint(&psVar22->heightsec->floorplane,(DVector2 *)&hsecResult);
    pFVar20 = this->Results;
    if (dVar23 < (this->Start).Z) {
      local_198.X = (pFVar20->HitPos).X;
      local_198.Y = (pFVar20->HitPos).Y;
      dVar23 = secplane_t::ZatPoint(&this->CurSector->heightsec->floorplane,&local_198);
      pFVar20 = this->Results;
      if ((pFVar20->HitPos).Z <= dVar23) {
        this->Results = &hsecResult;
        bVar14 = CheckPlane(this,&this->CurSector->heightsec->floorplane);
        if (bVar14) {
          pFVar8 = this->Results;
          pFVar8->CrossedWater = sectors + this->CurSector->sectornum;
          (pFVar8->CrossedWaterPos).Z = (pFVar8->HitPos).Z;
          dVar23 = (pFVar8->HitPos).Y;
          (pFVar8->CrossedWaterPos).X = (pFVar8->HitPos).X;
          (pFVar8->CrossedWaterPos).Y = dVar23;
          pFVar8->Distance = 0.0;
        }
        this->Results = pFVar20;
      }
    }
  }
  bVar14 = true;
  if (pFVar20->HitType == TRACE_HitNone) {
    if ((pFVar20->Distance != 0.0) || (NAN(pFVar20->Distance))) {
      bVar14 = false;
    }
    else {
      dVar23 = this->MaxDist;
      dVar1 = (this->Vec).X;
      dVar10 = (this->Vec).Y;
      (pFVar20->HitPos).Z = (this->Vec).Z * dVar23 + (this->Start).Z;
      dVar1 = (this->Start).X + dVar1 * dVar23;
      dVar23 = (this->Start).Y + dVar23 * dVar10;
      auVar9._8_4_ = SUB84(dVar23,0);
      auVar9._0_8_ = dVar1;
      auVar9._12_4_ = (int)((ulong)dVar23 >> 0x20);
      (pFVar20->HitPos).X = dVar1;
      (pFVar20->HitPos).Y = (double)auVar9._8_8_;
      SetSourcePosition(this);
      pFVar20 = this->Results;
      pFVar20->Distance = this->MaxDist;
      pFVar20->Fraction = 1.0;
      bVar14 = pFVar20->HitType != TRACE_HitNone;
    }
  }
  FPathTraverse::~FPathTraverse(&it);
  return bVar14;
}

Assistant:

bool FTraceInfo::TraceTraverse (int ptflags)
{
	// Do a 3D floor check in the starting sector
	Setup3DFloors();

	FPathTraverse it(Start.X, Start.Y, Vec.X * MaxDist, Vec.Y * MaxDist, ptflags | PT_DELTA, startfrac);
	intercept_t *in;
	int lastsplashsector = -1;

	while ((in = it.Next()))
	{
		// Deal with splashes in 3D floors (but only run once per sector, not each iteration - and stop if something was found.)
		if (Results->Crossed3DWater == NULL && lastsplashsector != CurSector->sectornum)
		{
			for (auto rover : CurSector->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_EXISTS) && (rover->flags&FF_SWIMMABLE))
				{
					if (Check3DFloorPlane(rover, false))
					{
						// only consider if the plane is above the actual floor.
						if (rover->top.plane->ZatPoint(Results->HitPos) > CurSector->floorplane.ZatPoint(Results->HitPos))
						{
							Results->Crossed3DWater = rover;
							Results->Crossed3DWaterPos = Results->HitPos;
							Results->Distance = 0;
						}
					}
				}
			}
			lastsplashsector = CurSector->sectornum;
		}

		double dist = MaxDist * in->frac;
		DVector3 hit = Start + Vec * dist;

		// Crossed a floor portal? 
		if (Vec.Z < 0 && !CurSector->PortalBlocksMovement(sector_t::floor))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::floor);
			if (hit.Z < portz && limitz > portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::floor, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}
		// ... or a ceiling portal?
		else if (Vec.Z > 0 && !CurSector->PortalBlocksMovement(sector_t::ceiling))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::ceiling);
			if (hit.Z > portz && limitz < portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::ceiling, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}

		if (in->isaline)
		{
			if (in->d.line->isLinePortal() && P_PointOnLineSidePrecise(Start, in->d.line) == 0)
			{
				sector_t *entersector = in->d.line->backsector;
				if (entersector == NULL || (hit.Z >= entersector->floorplane.ZatPoint(hit) && hit.Z <= entersector->ceilingplane.ZatPoint(hit)))
				{
					FLinePortal *port = in->d.line->getPortal();
					// The caller cannot handle portals without global offset.
					if (port->mType == PORTT_LINKED || !(TraceFlags & TRACE_PortalRestrict))
					{
						EnterLinePortal(it, in);
						continue;
					}
				}
			}
			if (!LineCheck(in, dist, hit)) break;
		}
		else if ((in->d.thing->flags & ActorMask) && in->d.thing != IgnoreThis)
		{
			if (!ThingCheck(in, dist, hit)) break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		if (CurSector->PortalBlocksMovement(sector_t::floor) && CheckSectorPlane(CurSector, true))
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else if (CurSector->PortalBlocksMovement(sector_t::ceiling) && CheckSectorPlane(CurSector, false))
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
	}

	// check for intersection with floor/ceiling
	Results->Sector = &sectors[CurSector->sectornum];

	if (Results->CrossedWater == NULL &&
		CurSector->heightsec != NULL &&
		CurSector->heightsec->floorplane.ZatPoint(Start) < Start.Z &&
		CurSector->heightsec->floorplane.ZatPoint(Results->HitPos) >= Results->HitPos.Z)
	{
		// Save the result so that the water check doesn't destroy it.
		FTraceResults *res = Results;
		FTraceResults hsecResult;
		Results = &hsecResult;

		if (CheckSectorPlane(CurSector->heightsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
		Results = res;
	}
	if (Results->HitType == TRACE_HitNone && Results->Distance == 0)
	{
		Results->HitPos = Start + Vec * MaxDist;
		SetSourcePosition();
		Results->Distance = MaxDist;
		Results->Fraction = 1.;
	}
	return Results->HitType != TRACE_HitNone;
}